

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngread.c
# Opt level: O3

int png_image_read_and_map(png_voidp argument)

{
  byte *pbVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  undefined8 *puVar6;
  png_const_structrp png_ptr;
  long lVar7;
  long lVar8;
  long lVar9;
  byte *pbVar10;
  byte bVar11;
  byte bVar12;
  byte bVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  char cVar17;
  char cVar19;
  ulong uVar21;
  ulong uVar22;
  ushort *row;
  undefined1 auVar23 [16];
  uint local_6c;
  uint local_68;
  char cVar18;
  char cVar20;
  
  puVar6 = *argument;
  png_ptr = *(png_const_structrp *)*puVar6;
  local_6c = 1;
  if (png_ptr->interlaced != '\0') {
    if (png_ptr->interlaced != '\x01') {
      png_error(png_ptr,"unknown interlace type");
    }
    local_6c = 7;
  }
  uVar3 = *(uint *)((long)puVar6 + 0xc);
  uVar4 = *(uint *)(puVar6 + 2);
  iVar5 = *(int *)((long)argument + 0x48);
  lVar7 = *(long *)((long)argument + 0x30);
  lVar8 = *(long *)((long)argument + 0x38);
  uVar16 = 0;
  do {
    uVar14 = (uint)uVar16;
    if (png_ptr->interlaced == '\x01') {
      bVar12 = (byte)(7 - uVar14 >> 1);
      bVar11 = 3;
      if (1 < uVar14) {
        bVar11 = bVar12;
      }
      uVar15 = (uVar14 & 1) << (3U - (char)(uVar14 + 1 >> 1) & 0x1f) & 7;
      if ((~(-1 << (bVar11 & 0x1f)) + uVar3) - uVar15 >> (bVar11 & 0x1f) != 0) {
        uVar21 = (ulong)(uint)(1 << (bVar12 & 0x1f));
        uVar16 = (ulong)((uVar14 & 1 ^ 1) << (3U - (char)(uVar16 >> 1) & 0x1f) & 7);
        local_68 = 8 >> ((byte)(uVar14 - 1 >> 1) & 0x1f);
        if (uVar14 < 3) {
          local_68 = 8;
        }
        uVar22 = (ulong)uVar15;
        goto LAB_001166a5;
      }
    }
    else {
      uVar21 = 1;
      local_68 = 1;
      uVar16 = 0;
      uVar22 = 0;
LAB_001166a5:
      for (; (uint)uVar16 < uVar4; uVar16 = (ulong)((uint)uVar16 + local_68)) {
        row = *(ushort **)((long)argument + 0x28);
        png_read_row(png_ptr,(png_bytep)row,(png_bytep)0x0);
        if (iVar5 - 1U < 4) {
          lVar9 = uVar16 * lVar8 + lVar7;
          pbVar1 = (byte *)(lVar9 + (ulong)uVar3);
          pbVar10 = (byte *)(lVar9 + uVar22);
          uVar15 = (uint)uVar22;
          switch(iVar5) {
          case 1:
            if (uVar15 < uVar3) {
              do {
                bVar11 = (byte)*row;
                bVar12 = *(byte *)((long)row + 1);
                if (bVar12 < 0xe6) {
                  bVar13 = 0xe7;
                  if (0x19 < bVar12) {
                    bVar13 = ((char)((uint)bVar11 + (uint)bVar11 * 4 + 0x82 >> 8) +
                             (char)((uint)bVar12 + (uint)bVar12 * 4 + 0x82 >> 8) * '\x06') - 0x1e;
                  }
                }
                else {
                  bVar13 = (byte)((uint)bVar11 * 0xe7 + 0x80 >> 8);
                }
                *pbVar10 = bVar13;
                pbVar10 = pbVar10 + uVar21;
                row = row + 1;
              } while (pbVar10 < pbVar1);
            }
            break;
          case 2:
            if (uVar15 < uVar3) {
              do {
                bVar11 = (byte)*row;
                if (bVar11 == 0xfe) {
                  bVar11 = 0xff;
                }
                if (*(byte *)((long)row + 1) == 0) {
                  bVar11 = 0xfe;
                }
                *pbVar10 = bVar11;
                pbVar10 = pbVar10 + uVar21;
                row = row + 1;
              } while (pbVar10 < pbVar1);
            }
            break;
          case 3:
            if (uVar15 < uVar3) {
              do {
                uVar2 = *row;
                bVar11 = (byte)(uVar2 >> 8);
                auVar23 = psllw(ZEXT316(CONCAT12(bVar11,uVar2) & 0xff00ff),2);
                *pbVar10 = (char)((uint)(byte)row[1] + (uint)(byte)row[1] * 4 + 0x82 >> 8) +
                           ((char)((ushort)(auVar23._2_2_ + (ushort)bVar11 + 0x82) >> 8) +
                           (char)((ushort)(auVar23._0_2_ + (uVar2 & 0xff) + 0x82) >> 8) * '\x06') *
                           '\x06';
                row = (ushort *)((long)row + 3);
                pbVar10 = pbVar10 + uVar21;
              } while (pbVar10 < pbVar1);
            }
            break;
          case 4:
            if (uVar15 < uVar3) {
              do {
                if (*(byte *)((long)row + 3) < 0xc4) {
                  bVar11 = 0xd8;
                  if (0x3f < *(byte *)((long)row + 3)) {
                    bVar11 = (byte)*row;
                    cVar17 = ((char)bVar11 < '\0') * '\t';
                    bVar12 = bVar11 & 0x40;
                    cVar19 = cVar17 + -0x1e;
                    cVar20 = cVar19;
                    if (bVar12 == 0) {
                      cVar19 = ((char)bVar11 < '\0') * '\t' + -0x27;
                      cVar20 = cVar17 + -0x27;
                    }
                    cVar17 = cVar20 + '\x03';
                    cVar18 = cVar20 + '\x03';
                    if (-1 < (char)bVar11) {
                      cVar17 = cVar19;
                      cVar18 = cVar20;
                    }
                    cVar19 = cVar18 + '\x03';
                    if (bVar12 == 0) {
                      cVar19 = cVar17;
                    }
                    bVar11 = ((bVar12 >> 6) - ((char)bVar11 >> 7)) + cVar19;
                  }
                }
                else {
                  uVar2 = *row;
                  bVar11 = (byte)(uVar2 >> 8);
                  auVar23 = psllw(ZEXT316(CONCAT12(bVar11,uVar2) & 0xff00ff),2);
                  bVar11 = (char)((uint)(byte)row[1] + (uint)(byte)row[1] * 4 + 0x82 >> 8) +
                           ((char)((ushort)(auVar23._2_2_ + (ushort)bVar11 + 0x82) >> 8) +
                           (char)((ushort)(auVar23._0_2_ + (uVar2 & 0xff) + 0x82) >> 8) * '\x06') *
                           '\x06';
                }
                *pbVar10 = bVar11;
                row = row + 2;
                pbVar10 = pbVar10 + uVar21;
              } while (pbVar10 < pbVar1);
            }
          }
        }
      }
    }
    uVar16 = (ulong)(uVar14 + 1);
    if (uVar14 + 1 == local_6c) {
      return 1;
    }
  } while( true );
}

Assistant:

static int
png_image_read_and_map(png_voidp argument)
{
   png_image_read_control *display = png_voidcast(png_image_read_control*,
       argument);
   png_imagep image = display->image;
   png_structrp png_ptr = image->opaque->png_ptr;
   int passes;

   /* Called when the libpng data must be transformed into the color-mapped
    * form.  There is a local row buffer in display->local and this routine must
    * do the interlace handling.
    */
   switch (png_ptr->interlaced)
   {
      case PNG_INTERLACE_NONE:
         passes = 1;
         break;

      case PNG_INTERLACE_ADAM7:
         passes = PNG_INTERLACE_ADAM7_PASSES;
         break;

      default:
         png_error(png_ptr, "unknown interlace type");
   }

   {
      png_uint_32  height = image->height;
      png_uint_32  width = image->width;
      int          proc = display->colormap_processing;
      png_bytep    first_row = png_voidcast(png_bytep, display->first_row);
      ptrdiff_t    step_row = display->row_bytes;
      int pass;

      for (pass = 0; pass < passes; ++pass)
      {
         unsigned int     startx, stepx, stepy;
         png_uint_32      y;

         if (png_ptr->interlaced == PNG_INTERLACE_ADAM7)
         {
            /* The row may be empty for a short image: */
            if (PNG_PASS_COLS(width, pass) == 0)
               continue;

            startx = PNG_PASS_START_COL(pass);
            stepx = PNG_PASS_COL_OFFSET(pass);
            y = PNG_PASS_START_ROW(pass);
            stepy = PNG_PASS_ROW_OFFSET(pass);
         }

         else
         {
            y = 0;
            startx = 0;
            stepx = stepy = 1;
         }

         for (; y<height; y += stepy)
         {
            png_bytep inrow = png_voidcast(png_bytep, display->local_row);
            png_bytep outrow = first_row + y * step_row;
            png_const_bytep end_row = outrow + width;

            /* Read read the libpng data into the temporary buffer. */
            png_read_row(png_ptr, inrow, NULL);

            /* Now process the row according to the processing option, note
             * that the caller verifies that the format of the libpng output
             * data is as required.
             */
            outrow += startx;
            switch (proc)
            {
               case PNG_CMAP_GA:
                  for (; outrow < end_row; outrow += stepx)
                  {
                     /* The data is always in the PNG order */
                     unsigned int gray = *inrow++;
                     unsigned int alpha = *inrow++;
                     unsigned int entry;

                     /* NOTE: this code is copied as a comment in
                      * make_ga_colormap above.  Please update the
                      * comment if you change this code!
                      */
                     if (alpha > 229) /* opaque */
                     {
                        entry = (231 * gray + 128) >> 8;
                     }
                     else if (alpha < 26) /* transparent */
                     {
                        entry = 231;
                     }
                     else /* partially opaque */
                     {
                        entry = 226 + 6 * PNG_DIV51(alpha) + PNG_DIV51(gray);
                     }

                     *outrow = (png_byte)entry;
                  }
                  break;

               case PNG_CMAP_TRANS:
                  for (; outrow < end_row; outrow += stepx)
                  {
                     png_byte gray = *inrow++;
                     png_byte alpha = *inrow++;

                     if (alpha == 0)
                        *outrow = PNG_CMAP_TRANS_BACKGROUND;

                     else if (gray != PNG_CMAP_TRANS_BACKGROUND)
                        *outrow = gray;

                     else
                        *outrow = (png_byte)(PNG_CMAP_TRANS_BACKGROUND+1);
                  }
                  break;

               case PNG_CMAP_RGB:
                  for (; outrow < end_row; outrow += stepx)
                  {
                     *outrow = PNG_RGB_INDEX(inrow[0], inrow[1], inrow[2]);
                     inrow += 3;
                  }
                  break;

               case PNG_CMAP_RGB_ALPHA:
                  for (; outrow < end_row; outrow += stepx)
                  {
                     unsigned int alpha = inrow[3];

                     /* Because the alpha entries only hold alpha==0.5 values
                      * split the processing at alpha==0.25 (64) and 0.75
                      * (196).
                      */

                     if (alpha >= 196)
                        *outrow = PNG_RGB_INDEX(inrow[0], inrow[1],
                            inrow[2]);

                     else if (alpha < 64)
                        *outrow = PNG_CMAP_RGB_ALPHA_BACKGROUND;

                     else
                     {
                        /* Likewise there are three entries for each of r, g
                         * and b.  We could select the entry by popcount on
                         * the top two bits on those architectures that
                         * support it, this is what the code below does,
                         * crudely.
                         */
                        unsigned int back_i = PNG_CMAP_RGB_ALPHA_BACKGROUND+1;

                        /* Here are how the values map:
                         *
                         * 0x00 .. 0x3f -> 0
                         * 0x40 .. 0xbf -> 1
                         * 0xc0 .. 0xff -> 2
                         *
                         * So, as above with the explicit alpha checks, the
                         * breakpoints are at 64 and 196.
                         */
                        if (inrow[0] & 0x80) back_i += 9; /* red */
                        if (inrow[0] & 0x40) back_i += 9;
                        if (inrow[0] & 0x80) back_i += 3; /* green */
                        if (inrow[0] & 0x40) back_i += 3;
                        if (inrow[0] & 0x80) back_i += 1; /* blue */
                        if (inrow[0] & 0x40) back_i += 1;

                        *outrow = (png_byte)back_i;
                     }

                     inrow += 4;
                  }
                  break;

               default:
                  break;
            }
         }
      }
   }

   return 1;
}